

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

boolean isclearpath(level *lev,coord *cc,int distance,schar dx,schar dy)

{
  boolean bVar1;
  char local_29;
  char local_28;
  int iStack_24;
  xchar y;
  xchar x;
  uchar typ;
  schar dy_local;
  schar dx_local;
  int distance_local;
  coord *cc_local;
  level *lev_local;
  
  local_28 = cc->x;
  local_29 = cc->y;
  iStack_24 = distance;
  do {
    if (iStack_24 < 1) {
      cc->x = local_28;
      cc->y = local_29;
      return '\x01';
    }
    local_28 = local_28 + dx;
    local_29 = local_29 + dy;
  } while (((('\0' < local_28) && (local_28 < 'P')) && (-1 < local_29)) &&
          (((local_29 < '\x15' && (0x10 < (byte)lev->locations[local_28][local_29].typ)) &&
           (bVar1 = closed_door(lev,(int)local_28,(int)local_29), iStack_24 = iStack_24 + -1,
           bVar1 == '\0'))));
  return '\0';
}

Assistant:

static boolean isclearpath(struct level *lev, coord *cc, int distance,
			   schar dx, schar dy)
{
	uchar typ;
	xchar x, y;

	x = cc->x;
	y = cc->y;
	while (distance-- > 0) {
		x += dx;
		y += dy;
		typ = lev->locations[x][y].typ;
		if (!isok(x,y) || !ZAP_POS(typ) || closed_door(lev, x,y))
			return FALSE;
	}
	cc->x = x;
	cc->y = y;
	return TRUE;
}